

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::objectivec::OneofEnumName_abi_cxx11_
          (string *__return_storage_ptr__,objectivec *this,OneofDescriptor *descriptor)

{
  string *input;
  Descriptor *descriptor_00;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  undefined1 local_21;
  Descriptor *local_20;
  Descriptor *fieldDescriptor;
  OneofDescriptor *descriptor_local;
  string *name;
  
  fieldDescriptor = (Descriptor *)this;
  descriptor_local = (OneofDescriptor *)__return_storage_ptr__;
  local_20 = OneofDescriptor::containing_type((OneofDescriptor *)this);
  local_21 = 0;
  ClassName_abi_cxx11_(__return_storage_ptr__,(objectivec *)local_20,descriptor_00);
  input = OneofDescriptor::name_abi_cxx11_((OneofDescriptor *)fieldDescriptor);
  anon_unknown_0::UnderscoresToCamelCase(&local_88,input,true);
  std::operator+(&local_68,"_",&local_88);
  std::operator+(&local_48,&local_68,"_OneOfCase");
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  return __return_storage_ptr__;
}

Assistant:

std::string OneofEnumName(const OneofDescriptor* descriptor) {
  const Descriptor* fieldDescriptor = descriptor->containing_type();
  std::string name = ClassName(fieldDescriptor);
  name += "_" + UnderscoresToCamelCase(descriptor->name(), true) + "_OneOfCase";
  // No sanitize needed because the OS never has names that end in _OneOfCase.
  return name;
}